

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_isAbsolute(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  undefined4 in_register_00000034;
  long lVar2;
  
  if (oargc == (uint *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (long)(int)*oargc;
  }
  if (getp_isAbsolute(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_isAbsolute(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_isAbsolute::desc.min_argc_ = 0;
      getp_isAbsolute::desc.opt_argc_ = 0;
      getp_isAbsolute::desc.varargs_ = 0;
      __cxa_guard_release(&getp_isAbsolute(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_isAbsolute::desc);
  if (iVar1 == 0) {
    iVar1 = fn_is_file_absolute((this->super_CVmObject).ext_ + 8);
    retval->typ = VM_TRUE - (iVar1 == 0);
    sp_ = sp_ + -lVar2;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_isAbsolute(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* ask the OS if we're absolute, and set the return value accordingly */
    retval->set_logical(fn_is_file_absolute(vmg_ get_ext()->get_str()));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}